

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseBlock(WastParser *this,Block *block)

{
  bool bVar1;
  Location local_48;
  Enum local_28;
  Enum local_24;
  Block *local_20;
  Block *block_local;
  WastParser *this_local;
  
  local_20 = block;
  block_local = (Block *)this;
  local_24 = (Enum)ParseBlockDeclaration(this,&block->decl);
  bVar1 = Failed((Result)local_24);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    local_28 = (Enum)ParseInstrList(this,&local_20->exprs);
    bVar1 = Failed((Result)local_28);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      GetLocation(&local_48,this);
      (local_20->end_loc).filename._M_len = local_48.filename._M_len;
      (local_20->end_loc).filename._M_str = local_48.filename._M_str;
      (local_20->end_loc).field_1.field_1.offset = (size_t)local_48.field_1.field_1.offset;
      *(undefined8 *)((long)&(local_20->end_loc).field_1 + 8) = local_48.field_1._8_8_;
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseBlock(Block* block) {
  WABT_TRACE(ParseBlock);
  CHECK_RESULT(ParseBlockDeclaration(&block->decl));
  CHECK_RESULT(ParseInstrList(&block->exprs));
  block->end_loc = GetLocation();
  return Result::Ok;
}